

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O1

bool __thiscall adios2::core::engine::BP4Reader::ProcessNextStepInMemory(BP4Reader *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  IO *pIVar4;
  size_t in_RSI;
  
  uVar2 = this->m_MDFileAlreadyReadSize;
  uVar3 = this->m_MDFileProcessedSize;
  if (uVar3 < uVar2) {
    pIVar4 = (this->super_Engine).m_IO;
    bVar1 = pIVar4->m_ReadStreaming;
    pIVar4->m_ReadStreaming = false;
    ProcessMetadataForNewSteps(this,in_RSI);
    ((this->super_Engine).m_IO)->m_ReadStreaming = bVar1;
  }
  return uVar3 < uVar2;
}

Assistant:

bool BP4Reader::ProcessNextStepInMemory()
{
    if (m_MDFileAlreadyReadSize > m_MDFileProcessedSize)
    {
        // Hack: processing metadata for multiple new steps only works
        // when pretending not to be in streaming mode
        const bool saveReadStreaming = m_IO.m_ReadStreaming;
        m_IO.m_ReadStreaming = false;
        ProcessMetadataForNewSteps(0);
        m_IO.m_ReadStreaming = saveReadStreaming;
        return true;
    }
    return false;
}